

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cpp
# Opt level: O2

int duckdb_brotli::InitializeCompoundDictionaryCopy
              (BrotliDecoderStateInternal *s,int address,int length)

{
  uint uVar1;
  BrotliDecoderCompoundDictionary *pBVar2;
  bool bVar3;
  byte bVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  BrotliDecoderCompoundDictionary *addon;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  
  pBVar2 = s->compound_dictionary;
  iVar7 = pBVar2->block_bits;
  if (iVar7 == -1) {
    iVar7 = pBVar2->total_size;
    iVar6 = -1;
    do {
      bVar4 = (char)iVar6 + 9U & 0x1f;
      iVar6 = iVar6 + 1;
    } while (iVar7 + -1 >> bVar4 != 0);
    pBVar2->block_bits = iVar6;
    lVar9 = 0;
    for (iVar12 = 0 >> bVar4; iVar12 < iVar7; iVar12 = iVar12 + (1 << ((byte)iVar6 & 0x1f))) {
      lVar8 = (long)(int)lVar9 + -1;
      do {
        lVar9 = lVar8 + 1;
        lVar5 = lVar8 + 2;
        lVar8 = lVar9;
      } while (pBVar2->chunk_offsets[lVar5] < iVar12);
      pBVar2->block_map[iVar12 >> ((byte)iVar6 & 0x1f)] = (uint8_t)lVar9;
      iVar7 = pBVar2->total_size;
    }
    iVar7 = pBVar2->block_bits;
  }
  uVar10 = (ulong)pBVar2->block_map[address >> ((byte)iVar7 & 0x1f)] - 1;
  do {
    uVar11 = uVar10 + 1;
    lVar9 = uVar10 + 2;
    uVar10 = uVar11;
  } while (pBVar2->chunk_offsets[lVar9] <= address);
  bVar3 = length + address <= pBVar2->total_size;
  if (bVar3) {
    uVar1 = s->dist_rb_idx;
    s->dist_rb[uVar1 & 3] = s->distance_code;
    s->dist_rb_idx = uVar1 + 1;
    s->meta_block_remaining_len = s->meta_block_remaining_len - length;
    pBVar2->br_index = (int)uVar11;
    pBVar2->br_offset = address - pBVar2->chunk_offsets[uVar11 & 0xffffffff];
    pBVar2->br_length = length;
    pBVar2->br_copied = 0;
  }
  return (uint)bVar3;
}

Assistant:

static BROTLI_BOOL InitializeCompoundDictionaryCopy(BrotliDecoderState *s, int address, int length) {
	BrotliDecoderCompoundDictionary *addon = s->compound_dictionary;
	int index;
	EnsureCoumpoundDictionaryInitialized(s);
	index = addon->block_map[address >> addon->block_bits];
	while (address >= addon->chunk_offsets[index + 1])
		index++;
	if (addon->total_size < address + length)
		return BROTLI_FALSE;
	/* Update the recent distances cache. */
	s->dist_rb[s->dist_rb_idx & 3] = s->distance_code;
	++s->dist_rb_idx;
	s->meta_block_remaining_len -= length;
	addon->br_index = index;
	addon->br_offset = address - addon->chunk_offsets[index];
	addon->br_length = length;
	addon->br_copied = 0;
	return BROTLI_TRUE;
}